

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QREncoder.cpp
# Opt level: O1

Version * ZXing::QRCode::ChooseVersion(int numInputBits,ErrorCorrectionLevel ecLevel)

{
  int iVar1;
  Version *pVVar2;
  Version *pVVar3;
  invalid_argument *this;
  int number;
  int iVar4;
  bool bVar5;
  
  iVar4 = numInputBits + 0xe;
  if (-1 < numInputBits + 7) {
    iVar4 = numInputBits + 7;
  }
  pVVar2 = Version::Model2(1);
  if (pVVar2->_totalCodewords -
      ((pVVar2->_ecBlocks)._M_elems[(int)ecLevel].blocks._M_elems[1].count +
      (pVVar2->_ecBlocks)._M_elems[(int)ecLevel].blocks._M_elems[0].count) *
      (pVVar2->_ecBlocks)._M_elems[(int)ecLevel].codewordsPerBlock < iVar4 >> 3) {
    iVar1 = 2;
    do {
      number = iVar1;
      pVVar3 = pVVar2;
      if (number == 0x29) break;
      pVVar3 = Version::Model2(number);
      iVar1 = number + 1;
    } while (pVVar3->_totalCodewords -
             ((pVVar3->_ecBlocks)._M_elems[(int)ecLevel].blocks._M_elems[1].count +
             (pVVar3->_ecBlocks)._M_elems[(int)ecLevel].blocks._M_elems[0].count) *
             (pVVar3->_ecBlocks)._M_elems[(int)ecLevel].codewordsPerBlock < iVar4 >> 3);
    bVar5 = 0x27 < number - 1U;
    pVVar2 = pVVar3;
  }
  else {
    bVar5 = false;
  }
  if (!bVar5) {
    return pVVar2;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Data too big");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static const Version& ChooseVersion(int numInputBits, ErrorCorrectionLevel ecLevel)
{
	for (int versionNum = 1; versionNum <= 40; versionNum++) {
		const Version* version = Version::Model2(versionNum);
		if (WillFit(numInputBits, *version, ecLevel)) {
			return *version;
		}
	}
	throw std::invalid_argument("Data too big");
}